

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s *
fiobj_data_read_slice(fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t length)

{
  long lVar1;
  size_t pos;
  intptr_t length_local;
  FIOBJ io_local;
  
  if (*(long *)(io + 0x28) == *(long *)(io + 0x20)) {
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    pos = length;
    if (length < 1) {
      pos = (*(long *)(io + 0x20) - *(long *)(io + 0x28)) + length;
    }
    if ((long)pos < 1) {
      memset(__return_storage_ptr__,0,0x18);
    }
    else {
      lVar1 = *(long *)(io + 0x28);
      *(size_t *)(io + 0x28) = lVar1 + pos;
      if (*(ulong *)(io + 0x20) < *(ulong *)(io + 0x28)) {
        *(undefined8 *)(io + 0x28) = *(undefined8 *)(io + 0x20);
      }
      fiobj_data_pread(__return_storage_ptr__,*(FIOBJ *)(io + 0x10),lVar1 + *(long *)(io + 0x18),
                       *(long *)(io + 0x28) - lVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fiobj_data_read_slice(FIOBJ io, intptr_t length) {
  if (obj2io(io)->pos == obj2io(io)->len) {
    /* EOF */
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  if (length <= 0) {
    /* read to EOF - length */
    length = (obj2io(io)->len - obj2io(io)->pos) + length;
  }

  if (length <= 0) {
    /* We are at EOF - length or beyond */
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  register size_t pos = obj2io(io)->pos;
  obj2io(io)->pos = pos + length;
  if (obj2io(io)->pos > obj2io(io)->len)
    obj2io(io)->pos = obj2io(io)->len;
  return fiobj_data_pread(obj2io(io)->source.parent, pos + obj2io(io)->capa,
                          (obj2io(io)->pos - pos));
}